

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  gengetopt_args_info *in_RDI;
  uint i;
  uint local_c;
  
  free_string_field((char **)0x142767);
  free_string_field((char **)0x142775);
  free_string_field((char **)0x142783);
  free_string_field((char **)0x142791);
  free_string_field((char **)0x14279f);
  free_string_field((char **)0x1427ad);
  free_string_field((char **)0x1427bb);
  free_string_field((char **)0x1427c9);
  free_string_field((char **)0x1427d7);
  free_string_field((char **)0x1427e8);
  free_string_field((char **)0x1427f9);
  free_string_field((char **)0x14280a);
  free_string_field((char **)0x14281b);
  free_string_field((char **)0x14282c);
  free_string_field((char **)0x14283d);
  free_string_field((char **)0x14284e);
  free_string_field((char **)0x14285f);
  free_string_field((char **)0x142870);
  for (local_c = 0; local_c < in_RDI->inputs_num; local_c = local_c + 1) {
    free(in_RDI->inputs[local_c]);
  }
  if (in_RDI->inputs_num != 0) {
    free(in_RDI->inputs);
  }
  clear_given(in_RDI);
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->input_arg));
  free_string_field (&(args_info->input_orig));
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->sele1_arg));
  free_string_field (&(args_info->sele1_orig));
  free_string_field (&(args_info->sele2_arg));
  free_string_field (&(args_info->sele2_orig));
  free_string_field (&(args_info->nbins_orig));
  free_string_field (&(args_info->nbins_z_orig));
  free_string_field (&(args_info->privilegedAxis_orig));
  free_string_field (&(args_info->centroidX_orig));
  free_string_field (&(args_info->centroidY_orig));
  free_string_field (&(args_info->referenceZ_orig));
  free_string_field (&(args_info->dropletR_orig));
  free_string_field (&(args_info->threshDens_orig));
  free_string_field (&(args_info->bufferLength_orig));
  free_string_field (&(args_info->rcut_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}